

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.h
# Opt level: O2

void __thiscall HighsCutSet::resize(HighsCutSet *this,HighsInt nnz)

{
  ulong uVar1;
  size_type __new_size;
  value_type_conflict1 local_28;
  
  uVar1 = (long)(this->cutindices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->cutindices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  __new_size = (size_type)(int)(uVar1 >> 2);
  local_28 = -INFINITY;
  std::vector<double,_std::allocator<double>_>::resize(&this->lower_,__new_size,&local_28);
  std::vector<double,_std::allocator<double>_>::resize(&this->upper_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->ARstart_,(long)(uVar1 * 0x40000000 + 0x100000000) >> 0x20);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARindex_,(long)nnz);
  std::vector<double,_std::allocator<double>_>::resize(&this->ARvalue_,(long)nnz);
  return;
}

Assistant:

void resize(HighsInt nnz) {
    HighsInt ncuts = numCuts();
    lower_.resize(ncuts, -kHighsInf);
    upper_.resize(ncuts);
    ARstart_.resize(ncuts + 1);
    ARindex_.resize(nnz);
    ARvalue_.resize(nnz);
  }